

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_test.cc
# Opt level: O0

void __thiscall
DSATest_MissingPrivate_Test::~DSATest_MissingPrivate_Test(DSATest_MissingPrivate_Test *this)

{
  DSATest_MissingPrivate_Test *this_local;
  
  ~DSATest_MissingPrivate_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DSATest, MissingPrivate) {
  bssl::UniquePtr<DSA> dsa = GetFIPSDSAGroup();
  ASSERT_TRUE(dsa);

  std::vector<uint8_t> sig(DSA_size(dsa.get()));
  unsigned sig_len;
  EXPECT_FALSE(DSA_sign(0, fips_digest, sizeof(fips_digest), sig.data(),
                        &sig_len, dsa.get()));
}